

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckBoundsCheckerOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  cmCTest *pcVar2;
  pointer piVar3;
  pointer pbVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  cmBoundsCheckerParser parser;
  ostringstream cmCTestLog_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  cmDuration local_248 [2];
  long local_238 [2];
  string *local_228;
  vector<int,_std::allocator<int>_> *local_220;
  long local_218;
  cmXMLParser local_210;
  cmCTest *local_1e8;
  int *local_1e0;
  int *piStack_1d8;
  long local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [376];
  
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  local_220 = results;
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmsys::SystemTools::Split(str,&local_268);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start test: ",0xc);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x3ae,(char *)local_210._vptr_cmXMLParser,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((ReportFunction *)local_210._vptr_cmXMLParser != &local_210.ReportCallback) {
    operator_delete(local_210._vptr_cmXMLParser,(ulong)(local_210.ReportCallback + 1));
  }
  local_228 = log;
  local_218 = lVar6;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
  }
  else {
    lVar6 = 0;
    uVar11 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)((long)&((local_268.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar6));
      if (iVar5 == 0) break;
      uVar11 = uVar11 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar11 < (ulong)((long)local_268.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_268.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  cmXMLParser::cmXMLParser(&local_210);
  local_1c8 = &local_1b8;
  local_210._vptr_cmXMLParser = (_func_int **)&PTR__cmBoundsCheckerParser_0070cfe8;
  local_1e0 = (int *)0x0;
  piStack_1d8 = (int *)0x0;
  local_1d0 = 0;
  local_1c0 = 0;
  local_1b8 = 0;
  local_210.ReportCallback = xmlReportError;
  local_210.ReportCallbackData = pcVar2;
  local_1e8 = pcVar2;
  cmXMLParser::InitializeParser(&local_210);
  uVar8 = (long)local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar11 < uVar8) && (uVar12 = uVar11 + 1, uVar12 < uVar8)) {
    lVar6 = uVar11 * 0x20;
    do {
      pbVar4 = local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = std::__cxx11::string::find
                        ((char *)((long)&local_268.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p + lVar6),0x59490b,0);
      if ((lVar9 == -1) &&
         (iVar5 = cmXMLParser::ParseChunk
                            (&local_210,*(char **)((long)&pbVar4[1]._M_dataplus._M_p + lVar6),
                             *(size_type *)((long)&pbVar4[1]._M_string_length + lVar6)), iVar5 == 0)
         ) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in ParseChunk: ",0x15);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,
                            *(char **)((long)&pbVar4[1]._M_dataplus._M_p + lVar6),
                            *(long *)((long)&pbVar4[1]._M_string_length + lVar6));
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x3c0,(char *)local_248[0].__r,false);
        if ((long *)local_248[0].__r != local_238) {
          operator_delete((void *)local_248[0].__r,local_238[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      uVar12 = uVar12 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar12 < (ulong)((long)local_268.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_268.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_1e0 == piStack_1d8) {
    iVar5 = 0;
  }
  else {
    piVar3 = (local_220->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = 0;
    piVar10 = local_1e0;
    do {
      piVar1 = piVar3 + *piVar10;
      *piVar1 = *piVar1 + 1;
      iVar5 = iVar5 + 1;
      piVar10 = piVar10 + 1;
    } while (piVar10 != piStack_1d8);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"End test (elapsed: ",0x13);
  lVar6 = std::chrono::_V2::steady_clock::now();
  local_248[0].__r = (double)(lVar6 - local_218) / 1000000000.0;
  cmDurationTo<unsigned_int>(local_248);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s)",2);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x3ce,(char *)local_248[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((long *)local_248[0].__r != local_238) {
    operator_delete((void *)local_248[0].__r,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if (iVar5 != 0) {
    std::__cxx11::string::_M_assign((string *)local_228);
  }
  this->DefectCount = this->DefectCount + iVar5;
  local_210._vptr_cmXMLParser = (_func_int **)&PTR__cmBoundsCheckerParser_0070cfe8;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (local_1e0 != (int *)0x0) {
    operator_delete(local_1e0,local_1d0 - (long)local_1e0);
  }
  cmXMLParser::~cmXMLParser(&local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  return iVar5 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckBoundsCheckerOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  log.clear();
  auto sttime = std::chrono::steady_clock::now();
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::vector<std::string>::size_type cc;
  for (cc = 0; cc < lines.size(); cc++) {
    if (lines[cc] == BOUNDS_CHECKER_MARKER) {
      break;
    }
  }
  cmBoundsCheckerParser parser(this->CTest);
  parser.InitializeParser();
  if (cc < lines.size()) {
    for (cc++; cc < lines.size(); ++cc) {
      std::string& theLine = lines[cc];
      // check for command line arguments that are not escaped
      // correctly by BC
      if (theLine.find("TargetArgs=") != std::string::npos) {
        // skip this because BC gets it wrong and we can't parse it
      } else if (!parser.ParseChunk(theLine.c_str(), theLine.size())) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Error in ParseChunk: " << theLine << std::endl);
      }
    }
  }
  int defects = 0;
  for (int err : parser.Errors) {
    results[err]++;
    defects++;
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  if (defects) {
    // only put the output of Bounds Checker if there were
    // errors or leaks detected
    log = parser.Log;
  }
  this->DefectCount += defects;
  return defects == 0;
}